

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O3

string_view __thiscall wabt::anon_unknown_7::NameApplier::FindLabelByVar(NameApplier *this,Var *var)

{
  bool bVar1;
  int iVar2;
  long in_RDX;
  uint uVar3;
  long lVar4;
  long lVar5;
  Module **ppMVar6;
  Module *__n;
  _func_int **__s1;
  string_view sVar7;
  
  if (*(int *)(in_RDX + 0x20) == 0) {
    lVar4 = (long)var - (long)this;
    __s1 = (_func_int **)0x0;
    __n = (Module *)0x0;
    if ((ulong)*(uint *)(in_RDX + 0x28) < (ulong)(lVar4 >> 5)) {
      lVar5 = ~(ulong)*(uint *)(in_RDX + 0x28) * 0x20;
      __s1 = *(_func_int ***)((long)this + lVar5 + lVar4);
      __n = *(Module **)((long)this + lVar5 + 8 + lVar4);
    }
  }
  else {
    if (*(int *)(in_RDX + 0x20) != 1) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                    ,0x36,"Index wabt::Var::index() const");
    }
    uVar3 = (int)((ulong)((long)var - (long)this) >> 5) - 1;
    if (-1 < (int)uVar3) {
      __n = *(Module **)(in_RDX + 0x30);
      ppMVar6 = &this->module_ + (ulong)uVar3 * 4;
      lVar4 = (ulong)uVar3 + 1;
      do {
        if (*ppMVar6 == __n) {
          __s1 = (((NameApplier *)(ppMVar6 + -1))->super_DelegateNop).super_Delegate._vptr_Delegate;
          if (__n == (Module *)0x0) goto LAB_00f293ca;
          iVar2 = bcmp(__s1,*(void **)(in_RDX + 0x28),(size_t)__n);
          if (iVar2 == 0) goto LAB_00f293fd;
        }
        ppMVar6 = ppMVar6 + -4;
        lVar5 = lVar4 + -1;
        bVar1 = 0 < lVar4;
        lVar4 = lVar5;
      } while (lVar5 != 0 && bVar1);
    }
    __s1 = (_func_int **)0x0;
LAB_00f293ca:
    __n = (Module *)0x0;
  }
LAB_00f293fd:
  sVar7.size_ = (size_type)__n;
  sVar7.data_ = (char *)__s1;
  return sVar7;
}

Assistant:

string_view NameApplier::FindLabelByVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        return label;
      }
    }
    return string_view();
  } else {
    if (var->index() >= labels_.size()) {
      return string_view();
    }
    return labels_[labels_.size() - 1 - var->index()];
  }
}